

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BuiltinVariableRenderTest::init
          (BuiltinVariableRenderTest *this,EVP_PKEY_CTX *ctx)

{
  VariableTest VVar1;
  bool bVar2;
  ContextType ctxType;
  int iVar3;
  undefined4 extraout_var;
  ShaderProgram *this_00;
  ShaderProgramDeclaration *pSVar4;
  NotSupportedError *pNVar5;
  bool *__s;
  char *pcVar6;
  ContextType local_460;
  allocator<char> local_45a;
  allocator<char> local_459;
  string local_458;
  FragmentOutput local_434;
  string local_430;
  GeometrySource local_410;
  float requiredPointSize;
  GenericVecType local_3d0;
  undefined1 local_3c8 [32];
  GenericVecType local_3a8;
  string local_3a0;
  FragmentSource local_380;
  string local_360;
  VertexSource local_340;
  string local_320 [32];
  string local_300 [32];
  GeometryToFragmentVarying local_2e0;
  VertexToGeometryVarying local_2d8;
  ostringstream buf;
  GeometryShaderDeclaration local_158;
  ShaderProgramDeclaration local_140;
  
  if (this->m_test == TEST_POINT_SIZE) {
    requiredPointSize = 5.0;
    local_3c8._0_8_ = (pointer)0x3f8000003f800000;
    ctxType.super_ApiType.m_bits =
         (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                    _vptr_RenderContext[2])();
    bVar2 = glu::contextSupports(ctxType,(ApiType)0x144);
    if (!bVar2) {
      bVar2 = glu::ContextInfo::isExtensionSupported
                        (((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->
                         m_contextInfo,"GL_EXT_geometry_point_size");
      if (!bVar2) {
        pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar5,"Tests require GL_EXT_geometry_point_size extension.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                   ,0xa2c);
        __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
    iVar3 = (*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar3) + 0x818))(0x846d,local_3c8);
    if ((float)local_3c8._4_4_ < 5.0) {
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<float>((string *)&local_140,&requiredPointSize);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                     "Test case requires point size ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140
                    );
      tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)&buf);
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  this_00 = (ShaderProgram *)operator_new(0x158);
  local_460.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  VVar1 = this->m_test;
  (this_00->super_VertexShader)._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00a09d90;
  (this_00->super_GeometryShader)._vptr_GeometryShader = (_func_int **)&DAT_00a09dc8;
  (this_00->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&DAT_00a09de0;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  std::__cxx11::string::string<std::allocator<char>>(local_300,"a_position",&local_459);
  std::__cxx11::string::string((string *)local_3c8,local_300);
  local_3a8 = GENERICVECTYPE_FLOAT;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(VertexAttribute *)local_3c8)
  ;
  if (VVar1 < TEST_LAST) {
    __s = *(bool **)(&DAT_00a0a478 + (ulong)VVar1 * 8);
  }
  else {
    __s = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>(local_320,__s,&local_45a);
  std::__cxx11::string::string((string *)&requiredPointSize,local_320);
  local_3d0 = GENERICVECTYPE_FLOAT;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<
                     (pSVar4,(VertexAttribute *)&requiredPointSize);
  local_2d8.type = GENERICVECTYPE_FLOAT;
  local_2d8.flatshade = false;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_2d8);
  local_2e0.type = GENERICVECTYPE_FLOAT;
  local_2e0.flatshade = false;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_2e0);
  local_434.type = GENERICVECTYPE_FLOAT;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_434);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  std::operator<<((ostream *)&buf,"${GLSL_VERSION_DECL}\nin highp vec4 a_position;\n");
  if (VVar1 == TEST_POINT_SIZE) {
    std::operator<<((ostream *)&buf,"in highp vec4 a_pointSize;\n");
    pcVar6 = "out highp vec4 v_geom_pointSize;\n";
LAB_003f183a:
    std::operator<<((ostream *)&buf,pcVar6);
  }
  else if (VVar1 == TEST_PRIMITIVE_ID) {
    std::operator<<((ostream *)&buf,"in highp vec4 a_primitiveID;\n");
    pcVar6 = "out highp vec4 v_geom_primitiveID;\n";
    goto LAB_003f183a;
  }
  std::operator<<((ostream *)&buf,
                  "void main (void)\n{\n\tgl_Position = a_position;\n\tgl_PointSize = 1.0;\n");
  if (VVar1 == TEST_POINT_SIZE) {
    pcVar6 = "\tv_geom_pointSize = a_pointSize;\n";
LAB_003f1876:
    std::operator<<((ostream *)&buf,pcVar6);
  }
  else if (VVar1 == TEST_PRIMITIVE_ID) {
    pcVar6 = "\tv_geom_primitiveID = a_primitiveID;\n";
    goto LAB_003f1876;
  }
  std::operator<<((ostream *)&buf,"}\n");
  std::__cxx11::stringbuf::str();
  specializeShader(&local_360,&local_458,&local_460);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  std::__cxx11::string::string((string *)&local_340,(string *)&local_360);
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_340);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  if (VVar1 < TEST_PRIMITIVE_ID) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,
               "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
               ,(allocator<char> *)&local_410);
    specializeShader(&local_430,&local_458,&local_460);
LAB_003f197e:
    std::__cxx11::string::~string((string *)&local_458);
  }
  else {
    if (VVar1 == TEST_PRIMITIVE_ID) {
      std::operator<<((ostream *)&buf,
                      "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tconst mediump vec4 red = vec4(1.0, 0.0, 0.0, 1.0);\n\tconst mediump vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst mediump vec4 blue = vec4(0.0, 0.0, 1.0, 1.0);\n\tconst mediump vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n\tconst mediump vec4 colors[4] = vec4[4](yellow, red, green, blue);\n\tfragColor = colors[gl_PrimitiveID % 4];\n}\n"
                     );
      std::__cxx11::stringbuf::str();
      specializeShader(&local_430,&local_458,&local_460);
      goto LAB_003f197e;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,(char *)0x0,(allocator<char> *)&local_458);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  std::__cxx11::string::string((string *)&local_380,(string *)&local_430);
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_380);
  local_158.outputType = (uint)(VVar1 != TEST_POINT_SIZE) * 2;
  local_158.inputType = GEOMETRYSHADERINPUTTYPE_POINTS;
  local_158.numOutputVertices = (ulong)local_158.outputType + 1;
  local_158.numInvocations = 1;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_158);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  std::operator<<((ostream *)&buf,"${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}");
  if (VVar1 == TEST_POINT_SIZE) {
    std::operator<<((ostream *)&buf,"#extension GL_EXT_geometry_point_size : require\n");
  }
  std::operator<<((ostream *)&buf,"layout(points) in;\n");
  if (VVar1 == TEST_POINT_SIZE) {
    std::operator<<((ostream *)&buf,"layout(points, max_vertices = 1) out;\n");
    std::operator<<((ostream *)&buf,"in highp vec4 v_geom_pointSize[];\n");
LAB_003f1a9b:
    pcVar6 = "out highp vec4 v_frag_FragColor;\n";
  }
  else {
    std::operator<<((ostream *)&buf,"layout(triangle_strip, max_vertices = 3) out;\n");
    if (VVar1 != TEST_PRIMITIVE_ID) goto LAB_003f1a9b;
    pcVar6 = "in highp vec4 v_geom_primitiveID[];\n";
  }
  std::operator<<((ostream *)&buf,pcVar6);
  std::operator<<((ostream *)&buf,"\nvoid main (void)\n{\n");
  if (VVar1 == TEST_POINT_SIZE) {
    pcVar6 = 
    "\tgl_Position = gl_in[0].gl_Position;\n\tgl_PointSize = v_geom_pointSize[0].x + 1.0;\n\tv_frag_FragColor = vec4(1.0, 1.0, 1.0, 1.0);\n\tEmitVertex();\n"
    ;
  }
  else if (VVar1 == TEST_PRIMITIVE_ID_IN) {
    pcVar6 = 
    "\tconst highp vec4 red = vec4(1.0, 0.0, 0.0, 1.0);\n\tconst highp vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 blue = vec4(0.0, 0.0, 1.0, 1.0);\n\tconst highp vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 colors[4] = vec4[4](red, green, blue, yellow);\n\n\tgl_Position = gl_in[0].gl_Position + vec4(0.05, 0.0, 0.0, 0.0);\n\tv_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n\tEmitVertex();\n\n\tgl_Position = gl_in[0].gl_Position - vec4(0.05, 0.0, 0.0, 0.0);\n\tv_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n\tEmitVertex();\n\n\tgl_Position = gl_in[0].gl_Position + vec4(0.0, 0.05, 0.0, 0.0);\n\tv_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n\tEmitVertex();\n"
    ;
  }
  else {
    if (VVar1 != TEST_PRIMITIVE_ID) goto LAB_003f1afa;
    pcVar6 = 
    "\tgl_Position = gl_in[0].gl_Position + vec4(0.05, 0.0, 0.0, 0.0);\n\tgl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n\tEmitVertex();\n\n\tgl_Position = gl_in[0].gl_Position - vec4(0.05, 0.0, 0.0, 0.0);\n\tgl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n\tEmitVertex();\n\n\tgl_Position = gl_in[0].gl_Position + vec4(0.0, 0.05, 0.0, 0.0);\n\tgl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n\tEmitVertex();\n\n"
    ;
  }
  std::operator<<((ostream *)&buf,pcVar6);
LAB_003f1afa:
  std::operator<<((ostream *)&buf,"}\n");
  std::__cxx11::stringbuf::str();
  specializeShader(&local_3a0,&local_458,&local_460);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  std::__cxx11::string::string((string *)&local_410,(string *)&local_3a0);
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_410);
  sglr::ShaderProgram::ShaderProgram(this_00,pSVar4);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&requiredPointSize);
  std::__cxx11::string::~string(local_320);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::~string(local_300);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this_00->super_VertexShader)._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00a09d90;
  (this_00->super_GeometryShader)._vptr_GeometryShader = (_func_int **)&DAT_00a09dc8;
  (this_00->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&DAT_00a09de0;
  *(VariableTest *)&this_00->field_0x154 = VVar1;
  this->m_program = (BuiltinVariableShader *)this_00;
  iVar3 = GeometryShaderRenderTest::init
                    (&this->super_GeometryShaderRenderTest,(EVP_PKEY_CTX *)pSVar4);
  return iVar3;
}

Assistant:

void BuiltinVariableRenderTest::init (void)
{
	// Requirements
	if (m_test == BuiltinVariableShader::TEST_POINT_SIZE)
	{
		const float requiredPointSize = 5.0f;

		tcu::Vec2 range = tcu::Vec2(1.0f, 1.0f);

		if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 4)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_point_size"))
			TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_point_size extension.");

		m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_POINT_SIZE_RANGE, range.getPtr());
		if (range.y() < requiredPointSize)
			throw tcu::NotSupportedError("Test case requires point size " + de::toString(requiredPointSize));
	}

	m_program = new BuiltinVariableShader(m_context.getRenderContext().getType(), m_test);

	// Shader init
	GeometryShaderRenderTest::init();
}